

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Clara::CommandLine<Catch::ConfigData>::ArgBuilder::
bind<Catch::ConfigData,std::__cxx11::string_const&>
          (ArgBuilder *this,
          _func_void_ConfigData_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
          *binaryFunction,string *placeholder)

{
  BoundArgFunction<Catch::ConfigData> local_20;
  
  local_20.functionObj = (IArgFunction<Catch::ConfigData> *)operator_new(0x10);
  (local_20.functionObj)->_vptr_IArgFunction = (_func_int **)&PTR__IArgFunction_00170778;
  local_20.functionObj[1]._vptr_IArgFunction = (_func_int **)binaryFunction;
  Detail::BoundArgFunction<Catch::ConfigData>::operator=
            ((BoundArgFunction<Catch::ConfigData> *)this->m_arg,&local_20);
  if (local_20.functionObj != (IArgFunction<Catch::ConfigData> *)0x0) {
    (*(local_20.functionObj)->_vptr_IArgFunction[1])();
  }
  std::__cxx11::string::_M_assign
            ((string *)&(this->m_arg->super_CommonArgProperties<Catch::ConfigData>).placeholder);
  return;
}

Assistant:

void bind( void (* binaryFunction)( C&, T ), std::string const& placeholder ) {
                m_arg->boundField = new Detail::BoundBinaryFunction<C, T>( binaryFunction );
                m_arg->placeholder = placeholder;
            }